

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightsamplers_test.cpp
# Opt level: O2

void __thiscall BVHLightSampling_PdfMethod_Test::TestBody(BVHLightSampling_PdfMethod_Test *this)

{
  undefined1 auVar1 [16];
  pointer pLVar2;
  memory_resource *pmVar3;
  Allocator alloc;
  SampledLight *pSVar4;
  Allocator alloc_00;
  int iVar5;
  char *message;
  long lVar6;
  bool bVar7;
  float fVar8;
  float u;
  Float actual;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined4 uVar12;
  span<const_pbrt::LightHandle> lights_00;
  undefined1 local_188 [16];
  AssertionResult gtest_ar;
  undefined1 local_158 [16];
  AssertHelper local_148;
  TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  local_140;
  vector<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_> tris;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> lights;
  undefined1 local_100 [40];
  undefined8 local_d8;
  optional<pbrt::SampledLight> sampledLight;
  RNG rng;
  BVHLightSampler distrib;
  
  pbrt::RNG::SetSequence(&rng,0x1483);
  lights.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tris.super__Vector_base<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lights.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  lights.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  tris.super__Vector_base<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  tris.super__Vector_base<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pmVar3 = pstd::pmr::new_delete_resource();
  randomLights((tuple<std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>,_std::vector<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_>_>
                *)&distrib,(int)pmVar3,alloc_00);
  local_100._8_8_ = &lights;
  local_100._0_8_ = &tris;
  std::
  tuple<std::vector<pbrt::LightHandle,std::allocator<pbrt::LightHandle>>&,std::vector<pbrt::ShapeHandle,std::allocator<pbrt::ShapeHandle>>&>
  ::operator=((tuple<std::vector<pbrt::LightHandle,std::allocator<pbrt::LightHandle>>&,std::vector<pbrt::ShapeHandle,std::allocator<pbrt::ShapeHandle>>&>
               *)local_100,
              (tuple<std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>,_std::vector<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_>_>
               *)&distrib);
  std::
  _Tuple_impl<0UL,_std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>,_std::vector<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_>_>
  ::~_Tuple_impl((_Tuple_impl<0UL,_std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>,_std::vector<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_>_>
                  *)&distrib);
  pLVar2 = lights.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar6 = (long)lights.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)lights.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                _M_impl.super__Vector_impl_data._M_start;
  alloc.memoryResource = pstd::pmr::new_delete_resource();
  lights_00.n = lVar6 >> 3;
  lights_00.ptr = pLVar2;
  pbrt::BVHLightSampler::BVHLightSampler(&distrib,lights_00,alloc);
  iVar5 = 100;
  while (bVar7 = iVar5 != 0, iVar5 = iVar5 + -1, bVar7) {
    local_188._0_4_ = pbrt::RNG::Uniform<float>(&rng);
    local_188._4_4_ = extraout_XMM0_Db;
    local_188._8_4_ = extraout_XMM0_Dc;
    local_188._12_4_ = extraout_XMM0_Dd;
    auVar9 = vfmadd132ss_fma(local_188,SUB6416(ZEXT464(0xbf800000),0),ZEXT416(0x40400000));
    local_158._0_4_ = pbrt::RNG::Uniform<float>(&rng);
    local_158._4_4_ = extraout_XMM0_Db_00;
    local_158._8_4_ = extraout_XMM0_Dc_00;
    local_158._12_4_ = extraout_XMM0_Dd_00;
    fVar8 = pbrt::RNG::Uniform<float>(&rng);
    u = pbrt::RNG::Uniform<float>(&rng);
    auVar1._4_4_ = extraout_XMM0_Db_01;
    auVar1._0_4_ = fVar8;
    auVar1._8_4_ = extraout_XMM0_Dc_01;
    auVar1._12_4_ = extraout_XMM0_Dd_01;
    auVar1 = vfmadd213ss_fma(auVar1,SUB6416(ZEXT464(0x40400000),0),SUB6416(ZEXT464(0xbf800000),0));
    auVar10 = vfmadd213ss_fma(local_158,SUB6416(ZEXT464(0x40400000),0),
                              SUB6416(ZEXT464(0xbf800000),0));
    local_188._0_4_ = auVar9._0_4_;
    auVar9._4_4_ = local_188._0_4_;
    auVar9._0_4_ = local_188._0_4_;
    auVar9._8_4_ = local_188._0_4_;
    auVar9._12_4_ = local_188._0_4_;
    uVar12 = auVar10._0_4_;
    auVar11._4_4_ = uVar12;
    auVar11._0_4_ = uVar12;
    auVar11._8_4_ = uVar12;
    auVar11._12_4_ = uVar12;
    auVar9 = vmovlhps_avx(auVar9,auVar11);
    uVar12 = auVar1._0_4_;
    auVar10._4_4_ = uVar12;
    auVar10._0_4_ = uVar12;
    auVar10._8_4_ = uVar12;
    auVar10._12_4_ = uVar12;
    local_100._16_8_ = vmovlps_avx(auVar10);
    local_d8._0_4_ = 0.0;
    local_d8._4_4_ = 0.0;
    local_100._24_16_ = ZEXT816(0) << 0x20;
    local_100._0_16_ = auVar9;
    pbrt::BVHLightSampler::Sample(&sampledLight,&distrib,(LightSampleContext *)local_100,u);
    if (sampledLight.set == true) {
      pSVar4 = pstd::optional<pbrt::SampledLight>::value(&sampledLight);
      fVar8 = pSVar4->pdf;
      local_100._16_8_ = vmovlps_avx(auVar10);
      local_d8._0_4_ = 0.0;
      local_d8._4_4_ = 0.0;
      local_100._24_16_ = ZEXT816(0) << 0x20;
      local_100._0_16_ = auVar9;
      pSVar4 = pstd::optional<pbrt::SampledLight>::value(&sampledLight);
      local_140.bits =
           (pSVar4->light).
           super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
           .bits;
      actual = pbrt::BVHLightSampler::PDF
                         (&distrib,(LightSampleContext *)local_100,(LightHandle *)&local_140);
      testing::internal::CmpHelperFloatingPointEQ<float>
                ((internal *)&gtest_ar,"sampledLight->pdf","distrib.PDF(intr, sampledLight->light)",
                 fVar8,actual);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)local_100);
        message = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_148,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lightsamplers_test.cpp"
                   ,0x121,message);
        testing::internal::AssertHelper::operator=(&local_148,(Message *)local_100);
        testing::internal::AssertHelper::~AssertHelper(&local_148);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_100);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
    }
    pstd::optional<pbrt::SampledLight>::~optional(&sampledLight);
  }
  pbrt::BVHLightSampler::~BVHLightSampler(&distrib);
  std::_Vector_base<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_>::~_Vector_base
            (&tris.super__Vector_base<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_>);
  std::_Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::~_Vector_base
            (&lights.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>);
  return;
}

Assistant:

TEST(BVHLightSampling, PdfMethod) {
    RNG rng(5251);
    auto r = [&rng]() { return rng.Uniform<Float>(); };

    std::vector<LightHandle> lights;
    std::vector<ShapeHandle> tris;
    std::tie(lights, tris) = randomLights(20, Allocator());

    BVHLightSampler distrib(lights, Allocator());
    for (int i = 0; i < 100; ++i) {
        Point3f p(-1 + 3 * r(), -1 + 3 * r(), -1 + 3 * r());
        Float u = rng.Uniform<Float>();
        Interaction intr(Point3fi(p), Normal3f(0, 0, 0), Point2f(0, 0));
        pstd::optional<SampledLight> sampledLight = distrib.Sample(intr, u);
        if (sampledLight)
            // It's actually legit to sometimes get no lights; as the bounds
            // tighten up as we get deeper in the tree, it may turn out that
            // the path we followed didn't have any lights after all.
            EXPECT_FLOAT_EQ(sampledLight->pdf, distrib.PDF(intr, sampledLight->light));
    }
}